

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O1

void __thiscall EhFrame::CIE::Begin(CIE *this)

{
  Writer *pWVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LEB128Wrapper<int> local_20;
  LEB128Wrapper<unsigned_int> local_1c;
  
  pWVar1 = (this->super_Entry).writer;
  if (pWVar1->cur != pWVar1->buffer) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EhFrame.cpp"
                       ,0x9f,"(writer->Count() == 0)","writer->Count() == 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  Entry::Begin(&this->super_Entry);
  Writer::Write<unsigned_int>((this->super_Entry).writer,0);
  Writer::Write<unsigned_char>((this->super_Entry).writer,'\x01');
  Writer::Write<unsigned_char>((this->super_Entry).writer,'\0');
  local_1c.value = 1;
  Writer::Write<unsigned_int>((this->super_Entry).writer,&local_1c);
  local_20.value = -8;
  Writer::Write<int>((this->super_Entry).writer,&local_20);
  Writer::Write<unsigned_char>((this->super_Entry).writer,'\x10');
  return;
}

Assistant:

void EhFrame::CIE::Begin()
{
    Assert(writer->Count() == 0);
    Entry::Begin();

    const uword cie_id = 0;
    Emit(cie_id);

    const ubyte version = 1;
    Emit(version);

    const ubyte augmentationString = 0; // none
    Emit(augmentationString);

    const ULEB128 codeAlignmentFactor = 1;
    Emit(codeAlignmentFactor);

    const LEB128 dataAlignmentFactor = - MachPtr;
    Emit(dataAlignmentFactor);

    const ubyte returnAddressRegister = DWARF_RegRA;
    Emit(returnAddressRegister);
}